

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week5-app1.cpp
# Opt level: O2

void __thiscall Vector<Date>::Vector(Vector<Date> *this,int N)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  Date *__s;
  ulong uVar3;
  
  this->N = N;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)N;
  uVar2 = SUB168(auVar1 * ZEXT816(0xc),0);
  uVar3 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0xc),8) == 0) {
    uVar3 = uVar2;
  }
  __s = (Date *)operator_new__(uVar3);
  if (N != 0) {
    uVar2 = uVar2 - 0xc;
    memset(__s,0,(uVar2 - uVar2 % 0xc) + 0xc);
  }
  this->values = __s;
  uVar2 = 0;
  uVar3 = (ulong)(uint)N;
  if (N < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 * 0xc - uVar2 != 0; uVar2 = uVar2 + 0xc) {
    *(undefined8 *)((long)&__s->year + uVar2) = 0;
    *(undefined4 *)((long)&__s->day + uVar2) = 0;
  }
  return;
}

Assistant:

Vector(int N) : N(N), values(new T[N])
    {
        for(auto i=0; i<N; ++i)
            values[i] = 0;
    }